

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureStateQueryTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::TextureStateQueryTests::init
          (TextureStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  TestContext *pTVar1;
  char *pcVar2;
  bool bVar3;
  TestNode *pTVar4;
  RenderContext *pRVar5;
  TestNode *pTVar6;
  TextureStateQueryTests *pTVar7;
  TesterType local_3e0;
  TesterType local_3dc;
  allocator<char> local_2c9;
  string local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  GLenum local_264;
  TesterType local_260;
  GLenum target;
  TesterType tester;
  int stateNdx_1;
  TestCaseGroup *targetGroup_1;
  int setterNdx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  QueryType local_1c4;
  char *pcStack_1c0;
  QueryType verifier_2;
  char *verifierSuffix_2;
  int verifierNdx_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  QueryType local_12c;
  char *pcStack_128;
  QueryType verifier_1;
  char *verifierSuffix_1;
  int verifierNdx_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  QueryType local_94;
  char *pcStack_90;
  QueryType verifier;
  char *verifierSuffix;
  int local_80;
  int verifierNdx;
  int stateNdx;
  allocator<char> local_51;
  string local_50;
  TestNode *local_20;
  TestCaseGroup *targetGroup;
  TextureStateQueryTests *pTStack_10;
  int targetNdx;
  TextureStateQueryTests *this_local;
  
  targetGroup._4_4_ = 0;
  pTVar7 = this;
  pTStack_10 = this;
  while ((int)targetGroup._4_4_ < 8) {
    pTVar4 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar4,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::textureTargets[(int)targetGroup._4_4_].name,
               init::textureTargets[(int)targetGroup._4_4_].name);
    local_20 = pTVar4;
    tcu::TestNode::addChild((TestNode *)this,pTVar4);
    pTVar4 = local_20;
    if ((init::textureTargets[(int)targetGroup._4_4_].newInGLES31 & 1U) != 0) {
      pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
      pRVar5 = Context::getRenderContext((this->super_TestCaseGroup).m_context);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"is_texture",&local_51)
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stateNdx,"IsTexture",(allocator<char> *)((long)&verifierNdx + 3));
      pTVar6 = &gls::TextureStateQueryTests::createIsTextureTest
                          (pTVar1,pRVar5,&local_50,(string *)&stateNdx,
                           init::textureTargets[(int)targetGroup._4_4_].target)->super_TestNode;
      tcu::TestNode::addChild(pTVar4,pTVar6);
      std::__cxx11::string::~string((string *)&stateNdx);
      std::allocator<char>::~allocator((allocator<char> *)((long)&verifierNdx + 3));
      std::__cxx11::string::~string((string *)&local_50);
      std::allocator<char>::~allocator(&local_51);
    }
    for (local_80 = 0; local_80 < 0x17; local_80 = local_80 + 1) {
      bVar3 = gls::TextureStateQueryTests::isLegalTesterForTarget
                        (init::textureTargets[(int)targetGroup._4_4_].target,
                         init::states[local_80].tester);
      if ((bVar3) &&
         (((init::textureTargets[(int)targetGroup._4_4_].newInGLES31 & 1U) != 0 ||
          ((init::states[local_80].newInGLES31 & 1U) != 0)))) {
        bVar3 = isExtendedParamQuery(init::states[local_80].tester);
        if (bVar3) {
          for (verifierSuffix._4_4_ = 0; verifierSuffix._4_4_ < 2;
              verifierSuffix._4_4_ = verifierSuffix._4_4_ + 1) {
            pcStack_90 = getVerifierSuffix(init::nonPureVerifiers[verifierSuffix._4_4_]);
            pTVar4 = local_20;
            local_94 = init::nonPureVerifiers[verifierSuffix._4_4_];
            pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
            pRVar5 = Context::getRenderContext((this->super_TestCaseGroup).m_context);
            std::__cxx11::string::string((string *)&local_f8);
            std::operator+(&local_d8,&local_f8,init::states[local_80].name);
            std::operator+(&local_b8,&local_d8,pcStack_90);
            pcVar2 = init::states[local_80].desc;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&verifierNdx_1,pcVar2,
                       (allocator<char> *)((long)&verifierSuffix_1 + 7));
            pTVar6 = &gls::TextureStateQueryTests::createTexParamTest
                                (pTVar1,pRVar5,&local_b8,(string *)&verifierNdx_1,local_94,
                                 init::textureTargets[(int)targetGroup._4_4_].target,
                                 init::states[local_80].tester)->super_TestNode;
            tcu::TestNode::addChild(pTVar4,pTVar6);
            std::__cxx11::string::~string((string *)&verifierNdx_1);
            std::allocator<char>::~allocator((allocator<char> *)((long)&verifierSuffix_1 + 7));
            std::__cxx11::string::~string((string *)&local_b8);
            std::__cxx11::string::~string((string *)&local_d8);
            std::__cxx11::string::~string((string *)&local_f8);
          }
        }
        else {
          bVar3 = isIsVectorQuery(init::states[local_80].tester);
          if (bVar3) {
            for (verifierSuffix_1._0_4_ = 0; (int)verifierSuffix_1 < 4;
                verifierSuffix_1._0_4_ = (int)verifierSuffix_1 + 1) {
              pcStack_128 = getVerifierSuffix(init::vec4Verifiers[(int)verifierSuffix_1]);
              pTVar4 = local_20;
              local_12c = init::vec4Verifiers[(int)verifierSuffix_1];
              pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
              pRVar5 = Context::getRenderContext((this->super_TestCaseGroup).m_context);
              std::__cxx11::string::string((string *)&local_190);
              std::operator+(&local_170,&local_190,init::states[local_80].name);
              std::operator+(&local_150,&local_170,pcStack_128);
              pcVar2 = init::states[local_80].desc;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&verifierNdx_2,pcVar2,
                         (allocator<char> *)((long)&verifierSuffix_2 + 7));
              pTVar6 = &gls::TextureStateQueryTests::createTexParamTest
                                  (pTVar1,pRVar5,&local_150,(string *)&verifierNdx_2,local_12c,
                                   init::textureTargets[(int)targetGroup._4_4_].target,
                                   init::states[local_80].tester)->super_TestNode;
              tcu::TestNode::addChild(pTVar4,pTVar6);
              std::__cxx11::string::~string((string *)&verifierNdx_2);
              std::allocator<char>::~allocator((allocator<char> *)((long)&verifierSuffix_2 + 7));
              std::__cxx11::string::~string((string *)&local_150);
              std::__cxx11::string::~string((string *)&local_170);
              std::__cxx11::string::~string((string *)&local_190);
            }
          }
          else {
            for (verifierSuffix_2._0_4_ = 0; (int)verifierSuffix_2 < 4;
                verifierSuffix_2._0_4_ = (int)verifierSuffix_2 + 1) {
              pcStack_1c0 = getVerifierSuffix(init::scalarVerifiers[(int)verifierSuffix_2]);
              pTVar4 = local_20;
              local_1c4 = init::scalarVerifiers[(int)verifierSuffix_2];
              pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
              pRVar5 = Context::getRenderContext((this->super_TestCaseGroup).m_context);
              std::__cxx11::string::string((string *)&local_228);
              std::operator+(&local_208,&local_228,init::states[local_80].name);
              std::operator+(&local_1e8,&local_208,pcStack_1c0);
              pcVar2 = init::states[local_80].desc;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&setterNdx,pcVar2,(allocator<char> *)((long)&targetGroup_1 + 7));
              pTVar6 = &gls::TextureStateQueryTests::createTexParamTest
                                  (pTVar1,pRVar5,&local_1e8,(string *)&setterNdx,local_1c4,
                                   init::textureTargets[(int)targetGroup._4_4_].target,
                                   init::states[local_80].tester)->super_TestNode;
              tcu::TestNode::addChild(pTVar4,pTVar6);
              std::__cxx11::string::~string((string *)&setterNdx);
              std::allocator<char>::~allocator((allocator<char> *)((long)&targetGroup_1 + 7));
              std::__cxx11::string::~string((string *)&local_1e8);
              std::__cxx11::string::~string((string *)&local_208);
              std::__cxx11::string::~string((string *)&local_228);
            }
          }
        }
      }
    }
    targetGroup._4_4_ = targetGroup._4_4_ + 1;
    pTVar7 = (TextureStateQueryTests *)(ulong)targetGroup._4_4_;
  }
  targetGroup_1._0_4_ = 0;
  while ((int)(uint)targetGroup_1 < 2) {
    pTVar4 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar4,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::pureSetters[(int)(uint)targetGroup_1].name,
               init::pureSetters[(int)(uint)targetGroup_1].desc);
    _tester = pTVar4;
    tcu::TestNode::addChild((TestNode *)this,pTVar4);
    for (target = 0; pTVar4 = _tester, (int)target < 0x11; target = target + 1) {
      if (init::pureSetters[(int)(uint)targetGroup_1].verifier == QUERY_TEXTURE_PARAM_PURE_INTEGER)
      {
        local_3dc = init::pureStates[(int)target].intTester;
      }
      else {
        if (init::pureSetters[(int)(uint)targetGroup_1].verifier ==
            QUERY_TEXTURE_PARAM_PURE_UNSIGNED_INTEGER) {
          local_3e0 = init::pureStates[(int)target].uintTester;
        }
        else {
          local_3e0 = TESTER_LAST;
        }
        local_3dc = local_3e0;
      }
      local_260 = local_3dc;
      local_264 = 0xde1;
      if (init::pureStates[(int)target].intTester == TESTER_TEXTURE_WRAP_R_SET_PURE_INT) {
        local_264 = 0x806f;
      }
      pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
      pRVar5 = Context::getRenderContext((this->super_TestCaseGroup).m_context);
      std::__cxx11::string::string((string *)&local_2a8);
      std::operator+(&local_288,&local_2a8,init::pureStates[(int)target].name);
      pcVar2 = init::pureStates[(int)target].desc;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c8,pcVar2,&local_2c9);
      pTVar6 = &gls::TextureStateQueryTests::createTexParamTest
                          (pTVar1,pRVar5,&local_288,&local_2c8,
                           init::pureSetters[(int)(uint)targetGroup_1].verifier,local_264,local_260)
                ->super_TestNode;
      tcu::TestNode::addChild(pTVar4,pTVar6);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::allocator<char>::~allocator(&local_2c9);
      std::__cxx11::string::~string((string *)&local_288);
      std::__cxx11::string::~string((string *)&local_2a8);
    }
    targetGroup_1._0_4_ = (uint)targetGroup_1 + 1;
    pTVar7 = (TextureStateQueryTests *)(ulong)(uint)targetGroup_1;
  }
  return (int)pTVar7;
}

Assistant:

void TextureStateQueryTests::init (void)
{
	static const QueryType scalarVerifiers[] =
	{
		QUERY_TEXTURE_PARAM_INTEGER,
		QUERY_TEXTURE_PARAM_FLOAT,
		QUERY_TEXTURE_PARAM_PURE_INTEGER,
		QUERY_TEXTURE_PARAM_PURE_UNSIGNED_INTEGER,
	};
	static const QueryType nonPureVerifiers[] =
	{
		QUERY_TEXTURE_PARAM_INTEGER,
		QUERY_TEXTURE_PARAM_FLOAT,
	};
	static const QueryType vec4Verifiers[] =
	{
		QUERY_TEXTURE_PARAM_INTEGER_VEC4,
		QUERY_TEXTURE_PARAM_FLOAT_VEC4,
		QUERY_TEXTURE_PARAM_PURE_INTEGER_VEC4,
		QUERY_TEXTURE_PARAM_PURE_UNSIGNED_INTEGER_VEC4,
	};

#define FOR_EACH_VERIFIER(VERIFIERS, X) \
	for (int verifierNdx = 0; verifierNdx < DE_LENGTH_OF_ARRAY(VERIFIERS); ++verifierNdx)	\
	{																						\
		const char* verifierSuffix = getVerifierSuffix((VERIFIERS)[verifierNdx]);			\
		const QueryType verifier = (VERIFIERS)[verifierNdx];								\
		targetGroup->addChild(X);															\
	}

	static const struct
	{
		const char*	name;
		glw::GLenum	target;
		bool		newInGLES31;
	} textureTargets[] =
	{
		{ "texture_2d",						GL_TEXTURE_2D,						false,	},
		{ "texture_3d",						GL_TEXTURE_3D,						false,	},
		{ "texture_2d_array",				GL_TEXTURE_2D_ARRAY,				false,	},
		{ "texture_cube_map",				GL_TEXTURE_CUBE_MAP,				false,	},
		{ "texture_2d_multisample",			GL_TEXTURE_2D_MULTISAMPLE,			true,	},
		{ "texture_2d_multisample_array",	GL_TEXTURE_2D_MULTISAMPLE_ARRAY,	true,	}, // GL_OES_texture_storage_multisample_2d_array
		{ "texture_buffer",					GL_TEXTURE_BUFFER,					true,	}, // GL_EXT_texture_buffer
		{ "texture_cube_array",				GL_TEXTURE_CUBE_MAP_ARRAY,			true,	}, // GL_EXT_texture_cube_map_array
	};
	static const struct
	{
		const char*	name;
		const char*	desc;
		TesterType	tester;
		bool		newInGLES31;
	} states[] =
	{
		{ "texture_swizzle_r",				"TEXTURE_SWIZZLE_R",				TESTER_TEXTURE_SWIZZLE_R,				false	},
		{ "texture_swizzle_g",				"TEXTURE_SWIZZLE_G",				TESTER_TEXTURE_SWIZZLE_G,				false	},
		{ "texture_swizzle_b",				"TEXTURE_SWIZZLE_B",				TESTER_TEXTURE_SWIZZLE_B,				false	},
		{ "texture_swizzle_a",				"TEXTURE_SWIZZLE_A",				TESTER_TEXTURE_SWIZZLE_A,				false	},
		{ "texture_wrap_s",					"TEXTURE_WRAP_S",					TESTER_TEXTURE_WRAP_S,					false	},
		{ "texture_wrap_t",					"TEXTURE_WRAP_T",					TESTER_TEXTURE_WRAP_T,					false	},
		{ "texture_wrap_r",					"TEXTURE_WRAP_R",					TESTER_TEXTURE_WRAP_R,					false	},
		{ "texture_mag_filter",				"TEXTURE_MAG_FILTER",				TESTER_TEXTURE_MAG_FILTER,				false	},
		{ "texture_min_filter",				"TEXTURE_MIN_FILTER",				TESTER_TEXTURE_MIN_FILTER,				false	},
		{ "texture_min_lod",				"TEXTURE_MIN_LOD",					TESTER_TEXTURE_MIN_LOD,					false	},
		{ "texture_max_lod",				"TEXTURE_MAX_LOD",					TESTER_TEXTURE_MAX_LOD,					false	},
		{ "texture_base_level",				"TEXTURE_BASE_LEVEL",				TESTER_TEXTURE_BASE_LEVEL,				false	},
		{ "texture_max_level",				"TEXTURE_MAX_LEVEL",				TESTER_TEXTURE_MAX_LEVEL,				false	},
		{ "texture_compare_mode",			"TEXTURE_COMPARE_MODE",				TESTER_TEXTURE_COMPARE_MODE,			false	},
		{ "texture_compare_func",			"TEXTURE_COMPARE_FUNC",				TESTER_TEXTURE_COMPARE_FUNC,			false	},
		{ "texture_immutable_levels",		"TEXTURE_IMMUTABLE_LEVELS",			TESTER_TEXTURE_IMMUTABLE_LEVELS,		false	},
		{ "texture_immutable_format",		"TEXTURE_IMMUTABLE_FORMAT",			TESTER_TEXTURE_IMMUTABLE_FORMAT,		false	},
		{ "depth_stencil_mode",				"DEPTH_STENCIL_TEXTURE_MODE",		TESTER_DEPTH_STENCIL_TEXTURE_MODE,		true	},
		{ "texture_srgb_decode",			"TEXTURE_SRGB_DECODE_EXT",			TESTER_TEXTURE_SRGB_DECODE_EXT,			true	},
		{ "texture_border_color",			"TEXTURE_BORDER_COLOR",				TESTER_TEXTURE_BORDER_COLOR,			true	},
		{ "texture_wrap_s_clamp_to_border",	"TEXTURE_WRAP_S_CLAMP_TO_BORDER",	TESTER_TEXTURE_WRAP_S_CLAMP_TO_BORDER,	true	},
		{ "texture_wrap_t_clamp_to_border",	"TEXTURE_WRAP_T_CLAMP_TO_BORDER",	TESTER_TEXTURE_WRAP_T_CLAMP_TO_BORDER,	true	},
		{ "texture_wrap_r_clamp_to_border",	"TEXTURE_WRAP_R_CLAMP_TO_BORDER",	TESTER_TEXTURE_WRAP_R_CLAMP_TO_BORDER,	true	},
	};
	static const struct
	{
		const char* name;
		const char* desc;
		QueryType	verifier;
	} pureSetters[] =
	{
		{ "set_pure_int",	"Set state with pure int",			QUERY_TEXTURE_PARAM_PURE_INTEGER			},
		{ "set_pure_uint",	"Set state with pure unsigned int",	QUERY_TEXTURE_PARAM_PURE_UNSIGNED_INTEGER	},
	};
	static const struct
	{
		const char*	name;
		const char*	desc;
		TesterType	intTester;
		TesterType	uintTester;
	} pureStates[] =
	{
		{ "texture_swizzle_r",				"TEXTURE_SWIZZLE_R",				TESTER_TEXTURE_SWIZZLE_R_SET_PURE_INT,			TESTER_TEXTURE_SWIZZLE_R_SET_PURE_UINT				},
		{ "texture_swizzle_g",				"TEXTURE_SWIZZLE_G",				TESTER_TEXTURE_SWIZZLE_G_SET_PURE_INT,			TESTER_TEXTURE_SWIZZLE_G_SET_PURE_UINT				},
		{ "texture_swizzle_b",				"TEXTURE_SWIZZLE_B",				TESTER_TEXTURE_SWIZZLE_B_SET_PURE_INT,			TESTER_TEXTURE_SWIZZLE_B_SET_PURE_UINT				},
		{ "texture_swizzle_a",				"TEXTURE_SWIZZLE_A",				TESTER_TEXTURE_SWIZZLE_A_SET_PURE_INT,			TESTER_TEXTURE_SWIZZLE_A_SET_PURE_UINT				},
		{ "texture_wrap_s",					"TEXTURE_WRAP_S",					TESTER_TEXTURE_WRAP_S_SET_PURE_INT,				TESTER_TEXTURE_WRAP_S_SET_PURE_UINT					},
		{ "texture_wrap_t",					"TEXTURE_WRAP_T",					TESTER_TEXTURE_WRAP_T_SET_PURE_INT,				TESTER_TEXTURE_WRAP_T_SET_PURE_UINT					},
		{ "texture_wrap_r",					"TEXTURE_WRAP_R",					TESTER_TEXTURE_WRAP_R_SET_PURE_INT,				TESTER_TEXTURE_WRAP_R_SET_PURE_UINT					},
		{ "texture_mag_filter",				"TEXTURE_MAG_FILTER",				TESTER_TEXTURE_MAG_FILTER_SET_PURE_INT,			TESTER_TEXTURE_MAG_FILTER_SET_PURE_UINT				},
		{ "texture_min_filter",				"TEXTURE_MIN_FILTER",				TESTER_TEXTURE_MIN_FILTER_SET_PURE_INT,			TESTER_TEXTURE_MIN_FILTER_SET_PURE_UINT				},
		{ "texture_min_lod",				"TEXTURE_MIN_LOD",					TESTER_TEXTURE_MIN_LOD_SET_PURE_INT,			TESTER_TEXTURE_MIN_LOD_SET_PURE_UINT				},
		{ "texture_max_lod",				"TEXTURE_MAX_LOD",					TESTER_TEXTURE_MAX_LOD_SET_PURE_INT,			TESTER_TEXTURE_MAX_LOD_SET_PURE_UINT				},
		{ "texture_base_level",				"TEXTURE_BASE_LEVEL",				TESTER_TEXTURE_BASE_LEVEL_SET_PURE_INT,			TESTER_TEXTURE_BASE_LEVEL_SET_PURE_UINT				},
		{ "texture_max_level",				"TEXTURE_MAX_LEVEL",				TESTER_TEXTURE_MAX_LEVEL_SET_PURE_INT,			TESTER_TEXTURE_MAX_LEVEL_SET_PURE_UINT				},
		{ "texture_compare_mode",			"TEXTURE_COMPARE_MODE",				TESTER_TEXTURE_COMPARE_MODE_SET_PURE_INT,		TESTER_TEXTURE_COMPARE_MODE_SET_PURE_UINT			},
		{ "texture_compare_func",			"TEXTURE_COMPARE_FUNC",				TESTER_TEXTURE_COMPARE_FUNC_SET_PURE_INT,		TESTER_TEXTURE_COMPARE_FUNC_SET_PURE_UINT			},
		// \note texture_immutable_levels is not settable
		// \note texture_immutable_format is not settable
		{ "depth_stencil_mode",				"DEPTH_STENCIL_TEXTURE_MODE",		TESTER_DEPTH_STENCIL_TEXTURE_MODE_SET_PURE_INT,	TESTER_DEPTH_STENCIL_TEXTURE_MODE_SET_PURE_UINT		},
		{ "texture_srgb_decode",			"TEXTURE_SRGB_DECODE_EXT",			TESTER_TEXTURE_SRGB_DECODE_EXT_SET_PURE_INT,	TESTER_TEXTURE_SRGB_DECODE_EXT_SET_PURE_UINT		},
		// \note texture_border_color is already checked
		// \note texture_wrap_*_clamp_to_border brings no additional coverage
	};

	for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(textureTargets); ++targetNdx)
	{
		tcu::TestCaseGroup* const targetGroup = new tcu::TestCaseGroup(m_testCtx, textureTargets[targetNdx].name, textureTargets[targetNdx].name);
		addChild(targetGroup);

		if (textureTargets[targetNdx].newInGLES31)
		{
			targetGroup->addChild(createIsTextureTest(m_testCtx,
													  m_context.getRenderContext(),
													  "is_texture",
													  "IsTexture",
													  textureTargets[targetNdx].target));
		}

		for (int stateNdx = 0; stateNdx < DE_LENGTH_OF_ARRAY(states); ++stateNdx)
		{
			if (!isLegalTesterForTarget(textureTargets[targetNdx].target, states[stateNdx].tester))
				continue;

			// for old targets, check only new states
			if (!textureTargets[targetNdx].newInGLES31 && !states[stateNdx].newInGLES31)
				continue;

			if (isExtendedParamQuery(states[stateNdx].tester))
			{
				// no need to cover for all getters if the only thing new is the param name
				FOR_EACH_VERIFIER(nonPureVerifiers, createTexParamTest(m_testCtx,
																	   m_context.getRenderContext(),
																	   std::string() + states[stateNdx].name + verifierSuffix,
																	   states[stateNdx].desc,
																	   verifier,
																	   textureTargets[targetNdx].target,
																	   states[stateNdx].tester));
			}
			else if (isIsVectorQuery(states[stateNdx].tester))
			{
				FOR_EACH_VERIFIER(vec4Verifiers, createTexParamTest(m_testCtx,
																	m_context.getRenderContext(),
																	std::string() + states[stateNdx].name + verifierSuffix,
																	states[stateNdx].desc,
																	verifier,
																	textureTargets[targetNdx].target,
																	states[stateNdx].tester));
			}
			else
			{
				FOR_EACH_VERIFIER(scalarVerifiers, createTexParamTest(m_testCtx,
																	  m_context.getRenderContext(),
																	  std::string() + states[stateNdx].name + verifierSuffix,
																	  states[stateNdx].desc,
																	  verifier,
																	  textureTargets[targetNdx].target,
																	  states[stateNdx].tester));
			}
		}
	}

#undef FOR_EACH_VERIFIER

	// set_pure_uint
	// set_pure_int
	for (int setterNdx = 0; setterNdx < DE_LENGTH_OF_ARRAY(pureSetters); ++setterNdx)
	{
		tcu::TestCaseGroup* const targetGroup = new tcu::TestCaseGroup(m_testCtx, pureSetters[setterNdx].name, pureSetters[setterNdx].desc);
		addChild(targetGroup);

		for (int stateNdx = 0; stateNdx < DE_LENGTH_OF_ARRAY(pureStates); ++stateNdx)
		{
			const TesterType	tester	= (pureSetters[setterNdx].verifier == QUERY_TEXTURE_PARAM_PURE_INTEGER)				? (pureStates[stateNdx].intTester)
										: (pureSetters[setterNdx].verifier == QUERY_TEXTURE_PARAM_PURE_UNSIGNED_INTEGER)	? (pureStates[stateNdx].uintTester)
										: (TESTER_LAST);
			// need 3d texture to test R wrap
			const glw::GLenum	target	= (pureStates[stateNdx].intTester == TESTER_TEXTURE_WRAP_R_SET_PURE_INT) ? (GL_TEXTURE_3D) : (GL_TEXTURE_2D);

			targetGroup->addChild(createTexParamTest(m_testCtx,
													 m_context.getRenderContext(),
													 std::string() + pureStates[stateNdx].name,
													 pureStates[stateNdx].desc,
													 pureSetters[setterNdx].verifier,
													 target,
													 tester));
		}
	}
}